

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O2

void __thiscall EventDispatcher::sendEventSync(EventDispatcher *this,Event *ev)

{
  Mutex *this_00;
  int iVar1;
  SyncEventHolder holder;
  
  holder.super_Event.mPriority = ev->mPriority;
  holder.super_Event.super_RefCount.mRefCount = 0;
  holder.super_Event.super_RefCount._12_4_ = 0xfffffffd;
  holder.super_Event.super_RefCount._vptr_RefCount = (_func_int **)&PTR_onRefCountZero_0012fef0;
  holder.mRealEvent.mObj = ev;
  RefCount::AddRef(&ev->super_RefCount);
  holder.mDone = false;
  EventQueue::SendEvent(&this->mQueue,&holder.super_Event);
  (*(this->super_IEventDispatcher)._vptr_IEventDispatcher[0xc])(this);
  iVar1 = (*(this->super_IEventDispatcher)._vptr_IEventDispatcher[7])(this);
  if ((char)iVar1 != '\0') {
    jh_log_print(1,"virtual void EventDispatcher::sendEventSync(Event *)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventDispatcher.cpp"
                 ,0xa3,"Sending sync event to your current thread, I will die now...");
  }
  this_00 = &this->mSyncLock;
  Mutex::Lock(this_00);
  while (holder.mDone == false) {
    Condition::Wait(&this->mSyncWait,this_00);
  }
  Mutex::Unlock(this_00);
  SyncEventHolder::~SyncEventHolder(&holder);
  return;
}

Assistant:

void EventDispatcher::sendEventSync( Event *ev )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	// event ref count handled by holder.
	SyncEventHolder holder( ev );

	mQueue.SendEvent( &holder );
	wakeThread();
	
	if (isThreadCurrent())
		LOG_ERR_FATAL("Sending sync event to your current thread, I will die now...");
	
	mSyncLock.Lock();
	while ( holder.mDone == false )
		mSyncWait.Wait( mSyncLock );
	mSyncLock.Unlock();
}